

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

void wabt::anon_unknown_0::FloatWriter<double>::WriteHex(char *out,size_t size,Uint bits)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  char *__dest;
  bool bVar4;
  undefined1 local_92;
  size_t local_90;
  size_t len;
  int nybble_1;
  Uint leading_zeroes;
  bool is_zero;
  Uint nybble;
  ulong uStack_60;
  int num_nybbles;
  Uint sig;
  int exp;
  bool is_neg;
  char *p;
  char buffer [40];
  Uint bits_local;
  size_t size_local;
  char *out_local;
  
  _exp = &p;
  sig._0_4_ = ((uint)(bits >> 0x34) & 0x7ff) - 0x3ff;
  uVar3 = bits & 0xfffffffffffff;
  if ((long)bits < 0) {
    _exp = (char **)((long)&p + 1);
    p._0_1_ = 0x2d;
  }
  buffer._32_8_ = bits;
  if ((int)sig == 0x400) {
    if (uVar3 == 0) {
      strcpy((char *)_exp,"inf");
      pcVar1 = (char *)((long)_exp + 3);
    }
    else {
      strcpy((char *)_exp,"nan");
      pcVar1 = (char *)((long)_exp + 3);
      if (uVar3 != 0x8000000000000) {
        strcpy((char *)((long)_exp + 3),":0x");
        _exp = (char **)((long)_exp + 6);
        nybble._4_4_ = 0x10;
        for (uStack_60 = uVar3; (uStack_60 & 0xf000000000000000) == 0; uStack_60 = uStack_60 << 4) {
          nybble._4_4_ = nybble._4_4_ + -1;
        }
        for (; pcVar1 = (char *)_exp, nybble._4_4_ != 0; nybble._4_4_ = nybble._4_4_ + -1) {
          *(char *)_exp = "0123456789abcdef"[uStack_60 >> 0x3c];
          uStack_60 = uStack_60 << 4;
          _exp = (char **)((long)_exp + 1);
        }
      }
    }
  }
  else {
    bVar4 = (int)sig != -0x3ff;
    strcpy((char *)_exp,"0x");
    local_92 = 0x30;
    if (uVar3 != 0 || bVar4) {
      local_92 = 0x31;
    }
    *(undefined1 *)((long)_exp + 2) = local_92;
    uStack_60 = uVar3 << 0xc;
    pcVar1 = (char *)((long)_exp + 3);
    if (uVar3 != 0) {
      if ((int)sig == -0x3ff) {
        uVar2 = Clz(uStack_60);
        if (uVar2 < 0x3f) {
          uStack_60 = uStack_60 << ((char)uVar2 + 1U & 0x3f);
        }
        else {
          uStack_60 = 0;
        }
        sig._0_4_ = -0x3ff - uVar2;
      }
      *(char *)((long)_exp + 3) = '.';
      _exp = (char **)((long)_exp + 4);
      for (; pcVar1 = (char *)_exp, uStack_60 != 0; uStack_60 = uStack_60 << 4) {
        *(char *)_exp = "0123456789abcdef"[(int)(uint)(uStack_60 >> 0x3c)];
        _exp = (char **)((long)_exp + 1);
      }
    }
    _exp = (char **)pcVar1;
    pcVar1 = (char *)_exp;
    __dest = (char *)((long)_exp + 1);
    *(char *)_exp = 'p';
    if (uVar3 != 0 || bVar4) {
      if ((int)sig < 0) {
        *__dest = '-';
        sig._0_4_ = -(int)sig;
      }
      else {
        *__dest = '+';
      }
      _exp = (char **)((long)_exp + 2);
      if (999 < (int)sig) {
        *(char *)_exp = '1';
        _exp = (char **)(pcVar1 + 3);
      }
      if (99 < (int)sig) {
        *(char *)_exp =
             (char)((long)((ulong)(uint)((int)((long)(int)sig / 100) >> 0x1f) << 0x20 |
                          (long)(int)sig / 100 & 0xffffffffU) % 10) + '0';
        _exp = (char **)((long)_exp + 1);
      }
      if (9 < (int)sig) {
        *(char *)_exp =
             (char)((long)((ulong)(uint)((int)((long)(int)sig / 10) >> 0x1f) << 0x20 |
                          (long)(int)sig / 10 & 0xffffffffU) % 10) + '0';
        _exp = (char **)((long)_exp + 1);
      }
      *(char *)_exp = (char)((int)sig % 10) + '0';
      pcVar1 = (char *)((long)_exp + 1);
    }
    else {
      strcpy(__dest,"+0");
      pcVar1 = (char *)((long)_exp + 3);
    }
  }
  _exp = (char **)pcVar1;
  local_90 = (long)_exp - (long)&p;
  if (size <= local_90) {
    local_90 = size - 1;
  }
  memcpy(out,&p,local_90);
  out[local_90] = '\0';
  return;
}

Assistant:

void FloatWriter<T>::WriteHex(char* out, size_t size, Uint bits) {
  static constexpr int kNumNybbles = Traits::kBits / 4;
  static constexpr int kTopNybbleShift = Traits::kBits - 4;
  static constexpr Uint kTopNybble = Uint(0xf) << kTopNybbleShift;
  static const char s_hex_digits[] = "0123456789abcdef";

  char buffer[Traits::kMaxHexBufferSize];
  char* p = buffer;
  bool is_neg = (bits >> Traits::kSignShift);
  int exp = ((bits >> Traits::kSigBits) & Traits::kExpMask) - Traits::kExpBias;
  Uint sig = bits & Traits::kSigMask;

  if (is_neg) {
    *p++ = '-';
  }
  if (exp == Traits::kMaxExp) {
    // Infinity or nan.
    if (sig == 0) {
      strcpy(p, "inf");
      p += 3;
    } else {
      strcpy(p, "nan");
      p += 3;
      if (sig != Traits::kQuietNanTag) {
        strcpy(p, ":0x");
        p += 3;
        // Skip leading zeroes.
        int num_nybbles = kNumNybbles;
        while ((sig & kTopNybble) == 0) {
          sig <<= 4;
          num_nybbles--;
        }
        while (num_nybbles) {
          Uint nybble = (sig >> kTopNybbleShift) & 0xf;
          *p++ = s_hex_digits[nybble];
          sig <<= 4;
          --num_nybbles;
        }
      }
    }
  } else {
    bool is_zero = sig == 0 && exp == Traits::kMinExp;
    strcpy(p, "0x");
    p += 2;
    *p++ = is_zero ? '0' : '1';

    // Shift sig up so the top 4-bits are at the top of the Uint.
    sig <<= Traits::kBits - Traits::kSigBits;

    if (sig) {
      if (exp == Traits::kMinExp) {
        // Subnormal; shift the significand up, and shift out the implicit 1.
        Uint leading_zeroes = Clz(sig);
        if (leading_zeroes < Traits::kSignShift) {
          sig <<= leading_zeroes + 1;
        } else {
          sig = 0;
        }
        exp -= leading_zeroes;
      }

      *p++ = '.';
      while (sig) {
        int nybble = (sig >> kTopNybbleShift) & 0xf;
        *p++ = s_hex_digits[nybble];
        sig <<= 4;
      }
    }
    *p++ = 'p';
    if (is_zero) {
      strcpy(p, "+0");
      p += 2;
    } else {
      if (exp < 0) {
        *p++ = '-';
        exp = -exp;
      } else {
        *p++ = '+';
      }
      if (exp >= 1000) {
        *p++ = '1';
      }
      if (exp >= 100) {
        *p++ = '0' + (exp / 100) % 10;
      }
      if (exp >= 10) {
        *p++ = '0' + (exp / 10) % 10;
      }
      *p++ = '0' + exp % 10;
    }
  }

  size_t len = p - buffer;
  if (len >= size) {
    len = size - 1;
  }
  memcpy(out, buffer, len);
  out[len] = '\0';
}